

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
* __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::operator=(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *other)

{
  value_t vVar1;
  json_value jVar2;
  
  assert_invariant(other);
  vVar1 = this->m_type;
  this->m_type = other->m_type;
  other->m_type = vVar1;
  jVar2 = this->m_value;
  this->m_value = other->m_value;
  other->m_value = jVar2;
  assert_invariant(this);
  return this;
}

Assistant:

basic_json& operator=(basic_json other) noexcept(
		std::is_nothrow_move_constructible<value_t>::value and std::is_nothrow_move_assignable<value_t>::value and
			std::is_nothrow_move_constructible<json_value>::value and
				std::is_nothrow_move_assignable<json_value>::value) {
		// check that passed value is valid
		other.assert_invariant();

		using std::swap;
		swap(m_type, other.m_type);
		swap(m_value, other.m_value);

		assert_invariant();
		return *this;
	}